

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O0

void * embree::alignedUSMMalloc(size_t size,size_t align,EmbreeUSMMode mode)

{
  void *pvVar1;
  size_t in_RSI;
  size_t in_RDI;
  
  pvVar1 = alignedMalloc(in_RDI,in_RSI);
  return pvVar1;
}

Assistant:

void* alignedUSMMalloc(size_t size, size_t align, EmbreeUSMMode mode)
  {
#if defined(EMBREE_SYCL_SUPPORT)
    if (tls_context)
      return alignedSYCLMalloc(tls_context,tls_device,size,align,mode);
    else
#endif
      return alignedMalloc(size,align);
  }